

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping>::moveAppend
          (QGenericArrayOps<QShader::SeparateToCombinedImageSamplerMapping> *this,
          SeparateToCombinedImageSamplerMapping *b,SeparateToCombinedImageSamplerMapping *e)

{
  qsizetype *pqVar1;
  SeparateToCombinedImageSamplerMapping *pSVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  int iVar7;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size;
      pDVar4 = (b->combinedSamplerName).d.d;
      (b->combinedSamplerName).d.d = (Data *)0x0;
      pSVar2[lVar3].combinedSamplerName.d.d = pDVar4;
      pcVar5 = (b->combinedSamplerName).d.ptr;
      (b->combinedSamplerName).d.ptr = (char *)0x0;
      pSVar2[lVar3].combinedSamplerName.d.ptr = pcVar5;
      qVar6 = (b->combinedSamplerName).d.size;
      (b->combinedSamplerName).d.size = 0;
      pSVar2[lVar3].combinedSamplerName.d.size = qVar6;
      iVar7 = b->samplerBinding;
      pSVar2[lVar3].textureBinding = b->textureBinding;
      pSVar2[lVar3].samplerBinding = iVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>).size
      ;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }